

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

int __thiscall deqp::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int i;
  long lVar1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  _Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_38;
  ShaderLibrary local_20;
  
  local_20.m_testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  local_20.m_renderCtx = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
  ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_38,&local_20,
             (this->m_filename)._M_dataplus._M_p);
  for (lVar1 = 0;
      lVar1 < (int)((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar1 = lVar1 + 1) {
    tcu::TestNode::addChild
              ((TestNode *)this,local_38._M_impl.super__Vector_impl_data._M_start[lVar1]);
  }
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base(&local_38);
  return extraout_EAX;
}

Assistant:

void ShaderLibraryGroup::init(void)
{
	deqp::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext());
	std::vector<tcu::TestNode*> children = shaderLibrary.loadShaderFile(m_filename.c_str());

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}